

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O3

char * path2basename(char *path)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(path,0x2f);
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = path;
  }
  return pcVar2;
}

Assistant:

const char *
path2basename(const char *path)
{
    const char *result;

#if defined(_WIN32) || defined(__CYGWIN__)
    result = strrchr(path, '\\');
#else
    result = strrchr(path, '/');
#endif

    return (result == NULL ? path : result + 1);
}